

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::logic<(moira::Instr)12,(moira::Size)2>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  uint uVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  u32 result;
  
  uVar2 = in_ESI & in_EDX;
  bVar1 = NBIT<(moira::Size)2>((ulong)uVar2);
  *(bool *)(in_RDI + 0x5c9b) = bVar1;
  bVar1 = ZERO<(moira::Size)2>((ulong)uVar2);
  *(bool *)(in_RDI + 0x5c9c) = bVar1;
  *(undefined1 *)(in_RDI + 0x5c9d) = 0;
  *(undefined1 *)(in_RDI + 0x5c9e) = 0;
  return uVar2;
}

Assistant:

u32
Moira::logic(u32 op1, u32 op2)
{
    u32 result;

    switch(I) {

        case AND: case ANDI: case ANDICCR: case ANDISR:
        {
            result = op1 & op2;
            break;
        }
        case OR: case ORI: case ORICCR: case ORISR:
        {
            result = op1 | op2;
            break;
        }
        case EOR: case EORI: case EORICCR: case EORISR:
        {
            result = op1 ^ op2;
            break;
        }
        default:
        {
            assert(false);
        }
    }

    reg.sr.n = NBIT<S>(result);
    reg.sr.z = ZERO<S>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;
    return result;
}